

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortHelper.cpp
# Opt level: O2

void Kernel::SortHelper::collectVariableSortsIter
               (CollectTask task,
               DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *map,
               bool ignoreBound)

{
  uint *this;
  anon_union_8_2_f154dc0f_for_Term_10 aVar1;
  undefined8 uVar2;
  Term *this_00;
  Symbol *this_01;
  uint64_t uVar3;
  ulong uVar4;
  CollectTask elem;
  CollectTask elem_00;
  CollectTask elem_01;
  CollectTask elem_02;
  CollectTask elem_03;
  CollectTask elem_04;
  CollectTask elem_05;
  CollectTask elem_06;
  CollectTask elem_07;
  CollectTask elem_08;
  CollectTask elem_09;
  CollectTask elem_10;
  CollectTask elem_11;
  undefined1 auVar5 [16];
  CollectTask elem_12;
  CollectTask elem_13;
  CollectTask elem_14;
  CollectTask elem_15;
  CollectTask elem_16;
  CollectTask elem_17;
  CollectTask elem_18;
  CollectTask elem_19;
  undefined1 auVar6 [16];
  CollectTask elem_20;
  CollectTask elem_21;
  CollectTask elem_22;
  CollectTask elem_23;
  _func_int ***ppp_Var7;
  CollectTask *pCVar8;
  bool bVar9;
  int iVar10;
  uint uVar11;
  TermList TVar12;
  long lVar13;
  TermList TVar14;
  OperatorType *pOVar15;
  socklen_t sVar16;
  uint i;
  uint uVar17;
  undefined8 *puVar18;
  Term *term;
  Term *t;
  uint *puVar19;
  anon_union_8_2_f154dc0f_for_Term_10 *paVar20;
  uint i_2;
  Stack<Kernel::SortHelper::CollectTask> local_2f8;
  MultiCounter bound;
  Substitution subst;
  undefined4 uStack_284;
  undefined4 uStack_26c;
  undefined4 uStack_254;
  undefined4 uStack_23c;
  undefined4 uStack_224;
  undefined4 uStack_20c;
  undefined4 uStack_1f4;
  undefined4 uStack_1dc;
  undefined4 uStack_1c4;
  undefined4 uStack_1ac;
  undefined4 uStack_194;
  undefined4 uStack_17c;
  undefined4 uStack_164;
  undefined4 uStack_14c;
  undefined4 uStack_134;
  undefined4 uStack_11c;
  undefined4 uStack_104;
  undefined4 uStack_ec;
  undefined4 uStack_d4;
  undefined4 uStack_bc;
  undefined4 uStack_a4;
  undefined4 uStack_8c;
  undefined4 uStack_74;
  undefined4 uStack_5c;
  undefined4 uStack_44;
  
  local_2f8._cursor = (CollectTask *)0x0;
  local_2f8._end = (CollectTask *)0x0;
  local_2f8._capacity = 0;
  local_2f8._stack = (CollectTask *)0x0;
  Lib::ZIArray<int>::ZIArray(&bound._counts);
  Lib::Stack<Kernel::SortHelper::CollectTask>::push(&local_2f8,task);
  pCVar8 = local_2f8._cursor;
switchD_0048cb18_default:
  do {
    do {
      local_2f8._cursor = pCVar8;
      if (local_2f8._cursor == local_2f8._stack) {
        Lib::Array<int>::~Array((Array<int> *)&bound);
        Lib::Stack<Kernel::SortHelper::CollectTask>::~Stack(&local_2f8);
        return;
      }
      pCVar8 = local_2f8._cursor + -1;
    } while (UNBIND < local_2f8._cursor[-1].fncTag);
    t = local_2f8._cursor[-1].field_1.t;
    switch(local_2f8._cursor[-1].fncTag) {
    case COLLECT_TERM:
      uVar17 = 0;
      local_2f8._cursor = pCVar8;
      for (paVar20 = (anon_union_8_2_f154dc0f_for_Term_10 *)
                     (t->_args + (*(uint *)&t->field_0xc & 0xfffffff)); aVar1 = *paVar20,
          pCVar8 = local_2f8._cursor, (aVar1._vars & 3) != 2; paVar20 = paVar20 + -1) {
        TVar12 = getArgSort(t,uVar17);
        elem._4_4_ = uStack_44;
        elem.fncTag = 1;
        elem.field_1.ts._content = (TermList)(TermList)aVar1;
        elem.contextSort._content = TVar12._content;
        Lib::Stack<Kernel::SortHelper::CollectTask>::push(&local_2f8,elem);
        uVar17 = uVar17 + 1;
      }
      break;
    case COLLECT_TERMLIST:
      TVar12._content = local_2f8._cursor[-1].contextSort._content;
      if (((uint)t & 3) == 1) {
        uVar17 = (uint)((ulong)t >> 2);
        local_2f8._cursor = pCVar8;
        if ((!ignoreBound) ||
           (iVar10 = Lib::MultiCounter::get(&bound,uVar17), pCVar8 = local_2f8._cursor, iVar10 == 0)
           ) {
          Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
                    (map,uVar17,TVar12);
          pCVar8 = local_2f8._cursor;
        }
      }
      else if (((ulong)t & 3) == 0) {
        elem_05._4_4_ = uStack_5c;
        elem_05.fncTag = (uint)(0xfffffff8 < t->_functor) * 2;
        elem_05.field_1.t = t;
        elem_05.contextSort._content = TVar12._content;
        local_2f8._cursor = pCVar8;
        Lib::Stack<Kernel::SortHelper::CollectTask>::push(&local_2f8,elem_05);
        pCVar8 = local_2f8._cursor;
      }
      break;
    case COLLECT_SPECIALTERM:
      if (0xfffffff8 < t->_functor) {
        this = &t[-1]._functor;
        switch(t->_functor) {
        case 0xfffffff9:
          TVar12._content._0_4_ = t[-1]._weight;
          TVar12._content._4_4_ = t[-1]._kboWeight;
          elem_13._4_4_ = uStack_164;
          elem_13.fncTag = 1;
          elem_13.field_1 =
               (anon_union_8_4_8765d89c_for_CollectTask_1)
               t->_args[*(uint *)&t->field_0xc & 0xfffffff]._content;
          elem_13.contextSort._content = TVar12._content;
          local_2f8._cursor = pCVar8;
          Lib::Stack<Kernel::SortHelper::CollectTask>::push(&local_2f8,elem_13);
          lVar13 = -2;
          uVar17 = 1;
          while( true ) {
            uVar11 = *(uint *)&t->field_0xc & 0xfffffff;
            pCVar8 = local_2f8._cursor;
            if (uVar11 <= uVar17) break;
            elem_14._4_4_ = uStack_17c;
            elem_14.fncTag = 1;
            elem_14.field_1 =
                 (anon_union_8_4_8765d89c_for_CollectTask_1)
                 t[1]._args[(ulong)uVar11 + lVar13 + -5]._content;
            elem_14.contextSort._content = TVar12._content;
            Lib::Stack<Kernel::SortHelper::CollectTask>::push(&local_2f8,elem_14);
            uVar3 = t->_args[(ulong)(*(uint *)&t->field_0xc & 0xfffffff) + lVar13]._content;
            TVar14 = Term::SpecialTermData::getSort((SpecialTermData *)this);
            elem_15._4_4_ = uStack_194;
            elem_15.fncTag = 1;
            elem_15.field_1 = (anon_union_8_4_8765d89c_for_CollectTask_1)uVar3;
            elem_15.contextSort._content = TVar14._content;
            Lib::Stack<Kernel::SortHelper::CollectTask>::push(&local_2f8,elem_15);
            uVar17 = uVar17 + 2;
            lVar13 = lVar13 + -2;
          }
          goto switchD_0048cb18_default;
        case 0xfffffffa:
          elem_12._4_4_ = uStack_134;
          elem_12.fncTag = 1;
          elem_12.field_1 =
               (anon_union_8_4_8765d89c_for_CollectTask_1)*(undefined8 *)&t[-1]._functor;
          elem_12.contextSort._content = t[-1]._args[0]._content;
          local_2f8._cursor = pCVar8;
          Lib::Stack<Kernel::SortHelper::CollectTask>::push(&local_2f8,elem_12);
          pCVar8 = local_2f8._cursor;
          goto switchD_0048cb18_default;
        case 0xfffffffb:
          uVar2 = *(undefined8 *)&t[-1]._maxRedLen;
          subst._map._timestamp = 1;
          subst._map._20_8_ = 0;
          subst._map._28_8_ = 0;
          subst._map._size = 0;
          subst._map._deleted = 0;
          subst._map._capacityIndex = 0;
          subst._map._capacity = 0;
          subst._map._afterLast._4_4_ = 0;
          puVar19 = *(uint **)&t[-1]._weight;
          local_2f8._cursor = pCVar8;
          pOVar15 = Signature::Symbol::fnType
                              (*(Symbol **)
                                (*(long *)(DAT_00a14190 + 0x60) + (ulong)t[-1]._functor * 8));
          for (uVar17 = 0; sVar16 = *(socklen_t *)pOVar15->_key,
              uVar17 < (pOVar15->_typeArgsArity + sVar16) - 1; uVar17 = uVar17 + 1) {
            uVar11 = *puVar19;
            puVar19 = *(uint **)(puVar19 + 2);
            TVar12 = AtomicSort::superSort();
            if (uVar17 < pOVar15->_typeArgsArity) {
              Kernel::Substitution::bind
                        (&subst,uVar17 & 0x3fffffff,(sockaddr *)(ulong)(uVar11 * 4 + 1),sVar16);
            }
            else {
              TVar12 = OperatorType::arg(pOVar15,uVar17);
              TVar12 = SubstHelper::applyImpl<false,Kernel::Substitution>(TVar12,&subst,false);
            }
            if ((!ignoreBound) || (iVar10 = Lib::MultiCounter::get(&bound,uVar11), iVar10 == 0)) {
              Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::
              insert(map,uVar11,TVar12);
            }
          }
          TVar12 = Term::SpecialTermData::getSort((SpecialTermData *)this);
          elem_16._4_4_ = uStack_ec;
          elem_16.fncTag = 1;
          elem_16.field_1 =
               (anon_union_8_4_8765d89c_for_CollectTask_1)
               t->_args[*(uint *)&t->field_0xc & 0xfffffff]._content;
          elem_16.contextSort._content = TVar12._content;
          Lib::Stack<Kernel::SortHelper::CollectTask>::push(&local_2f8,elem_16);
          TVar12 = SubstHelper::applyImpl<false,Kernel::Substitution>
                             (*(uint64_t *)
                               (pOVar15->_key + ((ulong)(*(int *)pOVar15->_key - 1) * 2 + 2) * 4),
                              &subst,false);
          elem_17._4_4_ = uStack_104;
          elem_17.fncTag = 1;
          elem_17.field_1 = (anon_union_8_4_8765d89c_for_CollectTask_1)uVar2;
          elem_17.contextSort._content = TVar12._content;
          Lib::Stack<Kernel::SortHelper::CollectTask>::push(&local_2f8,elem_17);
          break;
        case 0xfffffffc:
          auVar5._4_8_ = *(undefined8 *)this;
          auVar5._0_4_ = uStack_14c;
          auVar5._12_4_ = 0;
          auVar5 = auVar5 << 0x20;
          elem_11.contextSort._content = 2;
          elem_11.fncTag = auVar5._0_4_;
          elem_11._4_4_ = auVar5._4_4_;
          elem_11.field_1 = (anon_union_8_4_8765d89c_for_CollectTask_1)auVar5._8_8_;
          local_2f8._cursor = pCVar8;
          Lib::Stack<Kernel::SortHelper::CollectTask>::push(&local_2f8,elem_11);
          pCVar8 = local_2f8._cursor;
          goto switchD_0048cb18_default;
        case 0xfffffffd:
          elem_10._4_4_ = uStack_11c;
          elem_10.fncTag = 3;
          elem_10.field_1.ts._content = (TermList)(TermList)*(undefined8 *)this;
          elem_10.contextSort._content = 2;
          local_2f8._cursor = pCVar8;
          Lib::Stack<Kernel::SortHelper::CollectTask>::push(&local_2f8,elem_10);
          pCVar8 = local_2f8._cursor;
          goto switchD_0048cb18_default;
        case 0xfffffffe:
          this_00 = *(Term **)&t[-1]._maxRedLen;
          local_2f8._cursor = pCVar8;
          if ((((ulong)this_00 & 3) == 0) && (bVar9 = Term::isBoolean(this_00), bVar9)) {
            bVar9 = true;
            lVar13 = 0x80;
          }
          else {
            bVar9 = false;
            lVar13 = 0x60;
          }
          this_01 = *(Symbol **)(*(long *)(DAT_00a14190 + lVar13) + (ulong)t[-1]._functor * 8);
          puVar19 = *(uint **)&t[-1]._weight;
          subst._map._timestamp = 1;
          subst._map._20_8_ = 0;
          subst._map._28_8_ = 0;
          subst._map._size = 0;
          subst._map._deleted = 0;
          subst._map._capacityIndex = 0;
          subst._map._capacity = 0;
          subst._map._afterLast._4_4_ = 0;
          if (bVar9) {
            pOVar15 = Signature::Symbol::predType(this_01);
          }
          else {
            pOVar15 = Signature::Symbol::fnType(this_01);
          }
          for (uVar17 = 0; sVar16 = *(socklen_t *)pOVar15->_key,
              uVar17 < (pOVar15->_typeArgsArity + sVar16) - 1; uVar17 = uVar17 + 1) {
            uVar11 = *puVar19;
            puVar19 = *(uint **)(puVar19 + 2);
            TVar12 = AtomicSort::superSort();
            if (uVar17 < pOVar15->_typeArgsArity) {
              Kernel::Substitution::bind
                        (&subst,uVar17 & 0x3fffffff,(sockaddr *)(ulong)(uVar11 * 4 + 1),sVar16);
            }
            else {
              TVar12 = OperatorType::arg(pOVar15,uVar17);
              TVar12 = SubstHelper::applyImpl<false,Kernel::Substitution>(TVar12,&subst,false);
            }
            if ((!ignoreBound) || (iVar10 = Lib::MultiCounter::get(&bound,uVar11), iVar10 == 0)) {
              Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::
              insert(map,uVar11,TVar12);
            }
          }
          TVar12 = Term::SpecialTermData::getSort((SpecialTermData *)this);
          elem_22._4_4_ = uStack_bc;
          elem_22.fncTag = 1;
          elem_22.field_1 =
               (anon_union_8_4_8765d89c_for_CollectTask_1)
               t->_args[*(uint *)&t->field_0xc & 0xfffffff]._content;
          elem_22.contextSort._content = TVar12._content;
          Lib::Stack<Kernel::SortHelper::CollectTask>::push(&local_2f8,elem_22);
          if (!bVar9) {
            TVar12 = SubstHelper::applyImpl<false,Kernel::Substitution>
                               (*(uint64_t *)
                                 (pOVar15->_key + ((ulong)(*(int *)pOVar15->_key - 1) * 2 + 2) * 4),
                                &subst,false);
          }
          elem_23._4_4_ = uStack_d4;
          elem_23.fncTag = 1;
          elem_23.field_1.t = this_00;
          elem_23.contextSort._content = TVar12._content;
          Lib::Stack<Kernel::SortHelper::CollectTask>::push(&local_2f8,elem_23);
          break;
        case 0xffffffff:
          local_2f8._cursor = pCVar8;
          TVar12 = Term::SpecialTermData::getSort((SpecialTermData *)this);
          elem_00._4_4_ = uStack_74;
          elem_00.fncTag = 1;
          elem_00.field_1 =
               (anon_union_8_4_8765d89c_for_CollectTask_1)
               t->_args[*(uint *)&t->field_0xc & 0xfffffff]._content;
          elem_00.contextSort._content = TVar12._content;
          Lib::Stack<Kernel::SortHelper::CollectTask>::push(&local_2f8,elem_00);
          elem_01._4_4_ = uStack_8c;
          elem_01.fncTag = 1;
          elem_01.field_1 =
               (anon_union_8_4_8765d89c_for_CollectTask_1)
               t->_args[(ulong)(*(uint *)&t->field_0xc & 0xfffffff) - 1]._content;
          elem_01.contextSort._content = TVar12._content;
          Lib::Stack<Kernel::SortHelper::CollectTask>::push(&local_2f8,elem_01);
          elem_02._4_4_ = uStack_a4;
          elem_02.fncTag = 3;
          elem_02.field_1.ts._content = (TermList)(TermList)*(undefined8 *)this;
          elem_02.contextSort._content = TVar12._content;
          Lib::Stack<Kernel::SortHelper::CollectTask>::push(&local_2f8,elem_02);
          pCVar8 = local_2f8._cursor;
          goto switchD_0048cb18_default;
        }
        Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
                  (&subst._map);
        pCVar8 = local_2f8._cursor;
        break;
      }
      break;
    case COLLECT_FORMULA:
      switch(*(undefined4 *)&t->_vptr_Term) {
      case 0:
        uVar3 = t->_args[0]._content;
        local_2f8._cursor = pCVar8;
        if (*(int *)(uVar3 + 0xc) < 0) {
          uVar2 = *(undefined8 *)(uVar3 + 0x20);
          TVar12 = AtomicSort::superSort();
          elem_18._4_4_ = uStack_1ac;
          elem_18.fncTag = 1;
          elem_18.field_1 = (anon_union_8_4_8765d89c_for_CollectTask_1)uVar2;
          elem_18.contextSort._content = TVar12._content;
          Lib::Stack<Kernel::SortHelper::CollectTask>::push(&local_2f8,elem_18);
        }
        auVar6._4_8_ = uVar3;
        auVar6._0_4_ = uStack_1c4;
        auVar6._12_4_ = 0;
        auVar6 = auVar6 << 0x20;
        elem_19.contextSort._content = 2;
        elem_19.fncTag = auVar6._0_4_;
        elem_19._4_4_ = auVar6._4_4_;
        elem_19.field_1 = (anon_union_8_4_8765d89c_for_CollectTask_1)auVar6._8_8_;
        Lib::Stack<Kernel::SortHelper::CollectTask>::push(&local_2f8,elem_19);
        pCVar8 = local_2f8._cursor;
        break;
      case 1:
      case 2:
        puVar18 = (undefined8 *)t->_args[0]._content;
        local_2f8._cursor = pCVar8;
        while (pCVar8 = local_2f8._cursor, puVar18 != (undefined8 *)0x0) {
          uVar2 = *puVar18;
          puVar18 = (undefined8 *)puVar18[1];
          elem_09._4_4_ = uStack_23c;
          elem_09.fncTag = 3;
          elem_09.field_1 = (anon_union_8_4_8765d89c_for_CollectTask_1)uVar2;
          elem_09.contextSort._content = 2;
          Lib::Stack<Kernel::SortHelper::CollectTask>::push(&local_2f8,elem_09);
        }
        break;
      case 3:
      case 4:
      case 5:
        elem_03._4_4_ = uStack_254;
        elem_03.fncTag = 3;
        elem_03.field_1 = (anon_union_8_4_8765d89c_for_CollectTask_1)t->_args[0]._content;
        elem_03.contextSort._content = 2;
        local_2f8._cursor = pCVar8;
        Lib::Stack<Kernel::SortHelper::CollectTask>::push(&local_2f8,elem_03);
        elem_04._4_4_ = uStack_26c;
        elem_04.fncTag = 3;
        elem_04.field_1 = (anon_union_8_4_8765d89c_for_CollectTask_1)t[1]._vptr_Term;
        elem_04.contextSort._content = 2;
        Lib::Stack<Kernel::SortHelper::CollectTask>::push(&local_2f8,elem_04);
        pCVar8 = local_2f8._cursor;
        break;
      case 6:
        elem_21._4_4_ = uStack_284;
        elem_21.fncTag = 3;
        elem_21.field_1 = (anon_union_8_4_8765d89c_for_CollectTask_1)t->_args[0]._content;
        elem_21.contextSort._content = 2;
        local_2f8._cursor = pCVar8;
        Lib::Stack<Kernel::SortHelper::CollectTask>::push(&local_2f8,elem_21);
        pCVar8 = local_2f8._cursor;
        break;
      case 7:
      case 8:
        local_2f8._cursor = pCVar8;
        if (ignoreBound) {
          elem_06._4_4_ = uStack_1f4;
          elem_06.fncTag = 5;
          elem_06.field_1 = (anon_union_8_4_8765d89c_for_CollectTask_1)t->_args[0]._content;
          elem_06.contextSort._content = 2;
          Lib::Stack<Kernel::SortHelper::CollectTask>::push(&local_2f8,elem_06);
        }
        elem_07._4_4_ = uStack_20c;
        elem_07.fncTag = 3;
        elem_07.field_1 = (anon_union_8_4_8765d89c_for_CollectTask_1)*(undefined8 *)&t[1]._functor;
        elem_07.contextSort._content = 2;
        Lib::Stack<Kernel::SortHelper::CollectTask>::push(&local_2f8,elem_07);
        pCVar8 = local_2f8._cursor;
        if (ignoreBound) {
          elem_08._4_4_ = uStack_224;
          elem_08.fncTag = 4;
          elem_08.field_1 = (anon_union_8_4_8765d89c_for_CollectTask_1)t->_args[0]._content;
          elem_08.contextSort._content = 2;
          Lib::Stack<Kernel::SortHelper::CollectTask>::push(&local_2f8,elem_08);
          pCVar8 = local_2f8._cursor;
        }
        break;
      case 9:
        uVar4 = t->_args[0]._content;
        if ((uVar4 & 1) == 0) {
          uVar17 = *(uint *)(uVar4 + 8);
          local_2f8._cursor = pCVar8;
          TVar12 = AtomicSort::boolSort();
          elem_20._4_4_ = uStack_1dc;
          elem_20.fncTag = (uint)(0xfffffff8 < uVar17) * 2;
          elem_20.field_1.t = (Term *)uVar4;
          elem_20.contextSort._content = TVar12._content;
          Lib::Stack<Kernel::SortHelper::CollectTask>::push(&local_2f8,elem_20);
          pCVar8 = local_2f8._cursor;
        }
        else {
          local_2f8._cursor = pCVar8;
          if ((!ignoreBound) ||
             (iVar10 = Lib::MultiCounter::get(&bound,(int)(uVar4 >> 2)), pCVar8 = local_2f8._cursor,
             iVar10 == 0)) {
            TVar12 = AtomicSort::boolSort();
            Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
                      (map,(uint)(uVar4 >> 2),TVar12);
            pCVar8 = local_2f8._cursor;
          }
        }
      }
      break;
    case BIND:
      while (local_2f8._cursor = pCVar8, pCVar8 = local_2f8._cursor, t != (Term *)0x0) {
        ppp_Var7 = &t->_vptr_Term;
        t = *(Term **)&t->_functor;
        Lib::MultiCounter::inc(&bound,*(int *)ppp_Var7);
        pCVar8 = local_2f8._cursor;
      }
      break;
    case UNBIND:
      while (local_2f8._cursor = pCVar8, pCVar8 = local_2f8._cursor, t != (Term *)0x0) {
        ppp_Var7 = &t->_vptr_Term;
        t = *(Term **)&t->_functor;
        Lib::MultiCounter::dec(&bound,*(int *)ppp_Var7);
        pCVar8 = local_2f8._cursor;
      }
    }
  } while( true );
}

Assistant:

void SortHelper::collectVariableSortsIter(CollectTask task, DHMap<unsigned,TermList>& map, bool ignoreBound)
{
  Stack<CollectTask> todo;
  MultiCounter bound;

  todo.push(task);
  while (todo.isNonEmpty()) {
    CollectTask task = todo.pop();

    switch(task.fncTag) {
      case COLLECT_TERM: {
        Term* term = task.t;
    
        unsigned position = 0;
        for (TermList* ts = term->args(); ts->isNonEmpty(); ts = ts->next()) {
          CollectTask newTask(COLLECT_TERMLIST);
          newTask.ts = *ts;
          newTask.contextSort = getArgSort(term, position++);
          todo.push(newTask);
        }

      } break;

      case COLLECT_TERMLIST: {
        TermList ts = task.ts;

        if (ts.isTerm()) {
          Term* term = ts.term();

          CollectTask newTask(term->isSpecial() ? COLLECT_SPECIALTERM : COLLECT_TERM);
          newTask.t = term;
          newTask.contextSort = task.contextSort;
          todo.push(newTask);
        } else if (ts.isOrdinaryVar()) {
          unsigned var = ts.var();
          if (!ignoreBound || !bound.get(var)) {
            if (!map.insert(var, task.contextSort)) {
              ASS_EQ(task.contextSort, map.get(var));
            }
          }
        }

      } break;

      case COLLECT_SPECIALTERM: {
        Term* term = task.t;

        ASS(term->isSpecial());

        Term::SpecialTermData* sd = term->getSpecialData();

        switch (term->specialFunctor()) {
          case SpecialFunctor::ITE: {
            CollectTask newTask(COLLECT_TERMLIST);
            newTask.contextSort = sd->getSort();

            newTask.ts = *term->nthArgument(0);
            todo.push(newTask);

            newTask.ts = *term->nthArgument(1);
            todo.push(newTask);

            newTask.fncTag = COLLECT_FORMULA;
            newTask.f = sd->getCondition();
            todo.push(newTask);

            break;
          }

          case SpecialFunctor::LET: {
            TermList binding = sd->getBinding();
            bool isPredicate = binding.isTerm() && binding.term()->isBoolean();
            Signature::Symbol* symbol = isPredicate ? env.signature->getPredicate(sd->getFunctor())
                                                    : env.signature->getFunction(sd->getFunctor());
            VList::Iterator vit(sd->getVariables());
            Substitution subst;
            auto type = isPredicate ? symbol->predType() : symbol->fnType();
            for (unsigned i = 0; i < type->arity(); i++) {
              ASS(vit.hasNext());
              auto var = vit.next();
              TermList sort = AtomicSort::superSort();
              if (i < type->numTypeArguments()) {
                subst.bind(type->quantifiedVar(i).var(), TermList(var, false));
              } else {
                sort = SubstHelper::apply(type->arg(i),subst);
              }
              if (!ignoreBound || !bound.get(var)) {
                if (!map.insert(var, sort)) {
                  ASS_EQ(sort, map.get(var));
                }
              }
            }

            CollectTask newTask(COLLECT_TERMLIST);
            newTask.contextSort = sd->getSort();

            newTask.ts = *term->nthArgument(0);
            todo.push(newTask);

            newTask.ts = binding;
            if (!isPredicate) {
              newTask.contextSort = SubstHelper::apply(type->result(),subst);
            }
            todo.push(newTask);

            break;
          }

          case SpecialFunctor::LET_TUPLE: {
            TermList binding = sd->getBinding();
            Signature::Symbol* symbol = env.signature->getFunction(sd->getFunctor());
            Substitution subst;
            VList::Iterator vit(sd->getTupleSymbols());
            auto type = symbol->fnType();
            for (unsigned i = 0; i < type->arity(); i++) {
              ASS(vit.hasNext());
              auto var = vit.next();
              TermList sort = AtomicSort::superSort();
              if (i < type->numTypeArguments()) {
                subst.bind(type->quantifiedVar(i).var(), TermList(var, false));
              } else {
                sort = SubstHelper::apply(type->arg(i),subst);
              }
              if (!ignoreBound || !bound.get(var)) {
                if (!map.insert(var, sort)) {
                  ASS_EQ(sort, map.get(var));
                }
              }
            }

            CollectTask newTask(COLLECT_TERMLIST);
            newTask.contextSort = sd->getSort();
            newTask.ts = *term->nthArgument(0);
            todo.push(newTask);

            newTask.contextSort = SubstHelper::apply(type->result(),subst);
            newTask.ts = binding;
            todo.push(newTask);

            break;
          }

          case SpecialFunctor::FORMULA: {
            CollectTask newTask(COLLECT_FORMULA);
            newTask.f = sd->getFormula();
            todo.push(newTask);
          } break;
          case SpecialFunctor::LAMBDA: {
            CollectTask newTask(COLLECT_TERMLIST);
            newTask.contextSort = sd->getLambdaExpSort();
            newTask.ts = sd->getLambdaExp();
            todo.push(newTask);
          } break;

          case SpecialFunctor::TUPLE: {
            CollectTask newTask(COLLECT_TERM);
            newTask.t = sd->getTupleTerm();
            todo.push(newTask);
          } break;

          case SpecialFunctor::MATCH: {
            CollectTask newTask(COLLECT_TERMLIST);
            auto matchedSort = term->getSpecialData()->getMatchedSort();

            // there are two sorts here, one is the sort
            // of matched term and patterns, the other is
            // the sort of the match block and of each case
            newTask.ts = *term->nthArgument(0);
            newTask.contextSort = matchedSort;
            todo.push(newTask);
            for (unsigned int i = 1; i < term->arity(); i += 2) {
              newTask.ts = *term->nthArgument(i);
              newTask.contextSort = matchedSort;
              todo.push(newTask);

              newTask.ts = *term->nthArgument(i + 1);
              newTask.contextSort = sd->getSort();
              todo.push(newTask);
            }
            break;
          }
        }
      } break;

      case COLLECT_FORMULA: {
        Formula* f = task.f;

        switch (f->connective()) {
          case LITERAL: {
            Literal* lit = f->literal();
            if(lit->isTwoVarEquality()){
              CollectTask newTask(COLLECT_TERMLIST);
              newTask.ts = lit->twoVarEqSort();
              newTask.contextSort = AtomicSort::superSort();
              todo.push(newTask);
            }
            CollectTask newTask(COLLECT_TERM);
            newTask.t = lit;

            todo.push(newTask);
            break;
          }

          case BOOL_TERM: {
            TermList ts = f->getBooleanTerm();
            if (ts.isVar()) {
              if (!ignoreBound || !bound.get(ts.var())) {
                if (!map.insert(ts.var(), AtomicSort::boolSort())) {
                  ASS_EQ(AtomicSort::boolSort(), map.get(ts.var()));
                }
              }
            } else {
              ASS(ts.isTerm());

              CollectTask newTask(ts.term()->isSpecial() ? COLLECT_SPECIALTERM : COLLECT_TERM);
              newTask.t = ts.term();
              newTask.contextSort = AtomicSort::boolSort();

              todo.push(newTask);
            }
            break;
          }

          case EXISTS:
          case FORALL: {
            if (ignoreBound) {
              CollectTask unbindTask(UNBIND);
              unbindTask.vars = f->vars();
              todo.push(unbindTask);
            }

            CollectTask newTask(COLLECT_FORMULA);
            newTask.f = f->qarg();
            todo.push(newTask);

            if (ignoreBound) {
              CollectTask bindTask(BIND);
              bindTask.vars = f->vars();
              todo.push(bindTask);
            }
            break;
          }

          case AND:
          case OR: {
            FormulaList::Iterator argIt(f->args());
            while (argIt.hasNext()) {
              CollectTask newTask(COLLECT_FORMULA);
              newTask.f = argIt.next();
              todo.push(newTask);
            }
            break;
          }

          case IMP:
          case IFF:
          case XOR: {
            CollectTask leftTask(COLLECT_FORMULA);
            leftTask.f = f->left();
            todo.push(leftTask);

            CollectTask rightTask(COLLECT_FORMULA);
            rightTask.f = f->right();
            todo.push(rightTask);
            break;
          }

          case NOT: {
            CollectTask newTask(COLLECT_FORMULA);
            newTask.f = f->uarg();
            todo.push(newTask);
            break;
          }

          default:
            continue;
        }
      } break;

      case BIND: {
        VList::Iterator vit(task.vars);
        while (vit.hasNext()) {
          bound.inc(vit.next());
        }
      } break;

      case UNBIND: {
        VList::Iterator vit(task.vars);
        while (vit.hasNext()) {
          bound.dec(vit.next());
        }
      } break;
    }
  }
}